

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O0

void printitem(Item *q)

{
  long lVar1;
  short *in_RDI;
  Item *in_stack_fffffffffffffff0;
  
  if (*in_RDI == 1) {
    if (**(short **)(in_RDI + 4) == 1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 4) + 8);
      if (lVar1 == 1) {
        newline = 1;
      }
      else if (lVar1 == 2) {
        newline = 1;
        indent = indent + 1;
      }
      else if (lVar1 == 4) {
        newline = 1;
        indent = indent + -1;
      }
    }
    fprintf((FILE *)fcout," %s",*(undefined8 *)(*(long *)(in_RDI + 4) + 0x48));
  }
  else if (*in_RDI == 0x102) {
    fprintf((FILE *)fcout,"%s",*(undefined8 *)(in_RDI + 4));
  }
  else if (*in_RDI == 2) {
    printitem(in_stack_fffffffffffffff0);
  }
  else {
    fprintf((FILE *)fcout," %s",*(undefined8 *)(in_RDI + 4));
  }
  return;
}

Assistant:

void printitem(q) Item* q; {
		if (q->itemtype == SYMBOL) {
			if (SYM(q)->type == SPECIAL) {
				switch (SYM(q)->subtype) {

				case SEMI:
					newline = 1;
					break;
				case BEGINBLK:
					newline = 1;
					indent++;
					break;
				case ENDBLK:
					newline = 1;
					indent--;
					break;
				}
			}
			Fprintf(fcout, " %s", SYM(q)->name);
		} else if (q->itemtype == VERBATIM) {
			Fprintf(fcout, "%s", STR(q));
		} else if (q->itemtype == ITEM) {
			printitem(ITM(q));
		}else {
			Fprintf(fcout, " %s", STR(q));
		}
}